

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O3

void __thiscall
FunctionCallNode::FunctionCallNode
          (FunctionCallNode *this,string *name,
          list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
          *arguments)

{
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *plVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  (this->super_CallNode).super_ExpressionNode.super_Node.mark_.line = 1;
  (this->super_CallNode).super_ExpressionNode.super_Node.mark_.column = 0;
  (this->super_CallNode).super_ExpressionNode.super_Node._vptr_Node =
       (_func_int **)&PTR__FunctionCallNode_00150840;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar2,pcVar2 + name->_M_string_length);
  plVar1 = &this->arguments_;
  p_Var3 = (arguments->
           super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  (this->arguments_).
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = p_Var3;
  p_Var4 = (arguments->
           super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  (this->arguments_).
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = p_Var4;
  (this->arguments_).
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  ._M_impl._M_node._M_size =
       (arguments->
       super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
       )._M_impl._M_node._M_size;
  if (p_Var3 == (_List_node_base *)arguments) {
    (this->arguments_).
    super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (this->arguments_).
    super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  }
  else {
    p_Var4->_M_next = (_List_node_base *)plVar1;
    ((plVar1->
     super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
     )._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)plVar1;
    (arguments->
    super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)arguments;
    (arguments->
    super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)arguments;
    (arguments->
    super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
    )._M_impl._M_node._M_size = 0;
  }
  return;
}

Assistant:

FunctionCallNode(const std::string& name, 
    std::list<std::shared_ptr<ExpressionNode>> arguments):
      name_(name), arguments_(std::move(arguments)) {}